

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsTEXT::to_str(gdsTEXT *this)

{
  ostream *poVar1;
  void *pvVar2;
  gdsTEXT *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GDS TEXT class:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  layer: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->layer);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  textbody: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->textbody);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  scale: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->scale);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  xCor: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->xCor);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  yCor: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->yCor);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void gdsTEXT::to_str()
{
  cout << "GDS TEXT class:" << endl;

  cout << "  layer: " << this->layer << endl;
  cout << "  textbody: " << this->textbody << endl;
  cout << "  scale: " << this->scale << endl;
  cout << "  xCor: " << this->xCor << endl;
  cout << "  yCor: " << this->yCor << endl;
}